

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void pmevcntr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value,
                   uint8_t counter)

{
  uint32_t uVar1;
  uint8_t counter_local;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = pmu_num_counters(env);
  if (counter < uVar1) {
    pmevcntr_op_start(env,counter);
    (env->cp15).c14_pmevcntr[counter] = value;
    pmevcntr_op_finish(env,counter);
  }
  return;
}

Assistant:

static void pmevcntr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                             uint64_t value, uint8_t counter)
{
    if (counter < pmu_num_counters(env)) {
        pmevcntr_op_start(env, counter);
        env->cp15.c14_pmevcntr[counter] = value;
        pmevcntr_op_finish(env, counter);
    }
    /*
     * We opt to behave as a RAZ/WI when attempts to access PM[X]EVCNTR
     * are CONSTRAINED UNPREDICTABLE.
     */
}